

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# scanner.cpp
# Opt level: O2

IndentMarker * __thiscall YAML::Scanner::PushIndentTo(Scanner *this,int column,INDENT_TYPE type)

{
  int iVar1;
  TYPE type_00;
  tuple<YAML::Scanner::IndentMarker_*,_std::default_delete<YAML::Scanner::IndentMarker>_> tVar2;
  _Elt_pointer ppIVar3;
  Token *pTVar4;
  IndentMarker *pIVar5;
  Scanner *this_00;
  unique_ptr<YAML::Scanner::IndentMarker,_std::default_delete<YAML::Scanner::IndentMarker>_> pIndent
  ;
  __uniq_ptr_impl<YAML::Scanner::IndentMarker,_std::default_delete<YAML::Scanner::IndentMarker>_>
  local_30;
  
  if ((this->m_flows).c.
      super__Deque_base<YAML::Scanner::FLOW_MARKER,_std::allocator<YAML::Scanner::FLOW_MARKER>_>.
      _M_impl.super__Deque_impl_data._M_finish._M_cur ==
      (this->m_flows).c.
      super__Deque_base<YAML::Scanner::FLOW_MARKER,_std::allocator<YAML::Scanner::FLOW_MARKER>_>.
      _M_impl.super__Deque_impl_data._M_start._M_cur) {
    this_00 = (Scanner *)0x18;
    tVar2.
    super__Tuple_impl<0UL,_YAML::Scanner::IndentMarker_*,_std::default_delete<YAML::Scanner::IndentMarker>_>
    .super__Head_base<0UL,_YAML::Scanner::IndentMarker_*,_false>._M_head_impl =
         (_Tuple_impl<0UL,_YAML::Scanner::IndentMarker_*,_std::default_delete<YAML::Scanner::IndentMarker>_>
          )operator_new(0x18);
    *(int *)tVar2.
            super__Tuple_impl<0UL,_YAML::Scanner::IndentMarker_*,_std::default_delete<YAML::Scanner::IndentMarker>_>
            .super__Head_base<0UL,_YAML::Scanner::IndentMarker_*,_false>._M_head_impl = column;
    *(INDENT_TYPE *)
     ((long)tVar2.
            super__Tuple_impl<0UL,_YAML::Scanner::IndentMarker_*,_std::default_delete<YAML::Scanner::IndentMarker>_>
            .super__Head_base<0UL,_YAML::Scanner::IndentMarker_*,_false>._M_head_impl + 4) = type;
    *(int *)((long)tVar2.
                   super__Tuple_impl<0UL,_YAML::Scanner::IndentMarker_*,_std::default_delete<YAML::Scanner::IndentMarker>_>
                   .super__Head_base<0UL,_YAML::Scanner::IndentMarker_*,_false>._M_head_impl + 8) =
         0;
    ((int *)((long)tVar2.
                   super__Tuple_impl<0UL,_YAML::Scanner::IndentMarker_*,_std::default_delete<YAML::Scanner::IndentMarker>_>
                   .super__Head_base<0UL,_YAML::Scanner::IndentMarker_*,_false>._M_head_impl + 0x10)
    )[0] = 0;
    ((int *)((long)tVar2.
                   super__Tuple_impl<0UL,_YAML::Scanner::IndentMarker_*,_std::default_delete<YAML::Scanner::IndentMarker>_>
                   .super__Head_base<0UL,_YAML::Scanner::IndentMarker_*,_false>._M_head_impl + 0x10)
    )[1] = 0;
    ppIVar3 = (this->m_indents).c.
              super__Deque_base<YAML::Scanner::IndentMarker_*,_std::allocator<YAML::Scanner::IndentMarker_*>_>
              ._M_impl.super__Deque_impl_data._M_finish._M_cur;
    if (ppIVar3 ==
        (this->m_indents).c.
        super__Deque_base<YAML::Scanner::IndentMarker_*,_std::allocator<YAML::Scanner::IndentMarker_*>_>
        ._M_impl.super__Deque_impl_data._M_finish._M_first) {
      ppIVar3 = (this->m_indents).c.
                super__Deque_base<YAML::Scanner::IndentMarker_*,_std::allocator<YAML::Scanner::IndentMarker_*>_>
                ._M_impl.super__Deque_impl_data._M_finish._M_node[-1] + 0x40;
    }
    iVar1 = ppIVar3[-1]->column;
    pIndent._M_t.
    super___uniq_ptr_impl<YAML::Scanner::IndentMarker,_std::default_delete<YAML::Scanner::IndentMarker>_>
    ._M_t.
    super__Tuple_impl<0UL,_YAML::Scanner::IndentMarker_*,_std::default_delete<YAML::Scanner::IndentMarker>_>
    .super__Head_base<0UL,_YAML::Scanner::IndentMarker_*,_false>._M_head_impl =
         (__uniq_ptr_data<YAML::Scanner::IndentMarker,_std::default_delete<YAML::Scanner::IndentMarker>,_true,_true>
          )(__uniq_ptr_data<YAML::Scanner::IndentMarker,_std::default_delete<YAML::Scanner::IndentMarker>,_true,_true>
            )tVar2.
             super__Tuple_impl<0UL,_YAML::Scanner::IndentMarker_*,_std::default_delete<YAML::Scanner::IndentMarker>_>
             .super__Head_base<0UL,_YAML::Scanner::IndentMarker_*,_false>._M_head_impl;
    if ((column < iVar1) || ((iVar1 == column && ((type != SEQ || (ppIVar3[-1]->type != MAP)))))) {
      pIVar5 = (IndentMarker *)0x0;
    }
    else {
      type_00 = GetStartTokenFor(this_00,type);
      pTVar4 = PushToken(this,type_00);
      *(Token **)
       ((long)tVar2.
              super__Tuple_impl<0UL,_YAML::Scanner::IndentMarker_*,_std::default_delete<YAML::Scanner::IndentMarker>_>
              .super__Head_base<0UL,_YAML::Scanner::IndentMarker_*,_false>._M_head_impl + 0x10) =
           pTVar4;
      local_30._M_t.
      super__Tuple_impl<0UL,_YAML::Scanner::IndentMarker_*,_std::default_delete<YAML::Scanner::IndentMarker>_>
      .super__Head_base<0UL,_YAML::Scanner::IndentMarker_*,_false>._M_head_impl =
           (tuple<YAML::Scanner::IndentMarker_*,_std::default_delete<YAML::Scanner::IndentMarker>_>)
           (tuple<YAML::Scanner::IndentMarker_*,_std::default_delete<YAML::Scanner::IndentMarker>_>)
           tVar2.
           super__Tuple_impl<0UL,_YAML::Scanner::IndentMarker_*,_std::default_delete<YAML::Scanner::IndentMarker>_>
           .super__Head_base<0UL,_YAML::Scanner::IndentMarker_*,_false>._M_head_impl;
      std::deque<YAML::Scanner::IndentMarker*,std::allocator<YAML::Scanner::IndentMarker*>>::
      emplace_back<YAML::Scanner::IndentMarker*>
                ((deque<YAML::Scanner::IndentMarker*,std::allocator<YAML::Scanner::IndentMarker*>> *
                 )&this->m_indents,(IndentMarker **)&local_30);
      std::
      vector<std::unique_ptr<YAML::Scanner::IndentMarker,std::default_delete<YAML::Scanner::IndentMarker>>,std::allocator<std::unique_ptr<YAML::Scanner::IndentMarker,std::default_delete<YAML::Scanner::IndentMarker>>>>
      ::
      emplace_back<std::unique_ptr<YAML::Scanner::IndentMarker,std::default_delete<YAML::Scanner::IndentMarker>>>
                ((vector<std::unique_ptr<YAML::Scanner::IndentMarker,std::default_delete<YAML::Scanner::IndentMarker>>,std::allocator<std::unique_ptr<YAML::Scanner::IndentMarker,std::default_delete<YAML::Scanner::IndentMarker>>>>
                  *)&this->m_indentRefs,&pIndent);
      pIVar5 = (this->m_indentRefs).m_data.
               super__Vector_base<std::unique_ptr<YAML::Scanner::IndentMarker,_std::default_delete<YAML::Scanner::IndentMarker>_>,_std::allocator<std::unique_ptr<YAML::Scanner::IndentMarker,_std::default_delete<YAML::Scanner::IndentMarker>_>_>_>
               ._M_impl.super__Vector_impl_data._M_finish[-1]._M_t.
               super___uniq_ptr_impl<YAML::Scanner::IndentMarker,_std::default_delete<YAML::Scanner::IndentMarker>_>
               ._M_t.
               super__Tuple_impl<0UL,_YAML::Scanner::IndentMarker_*,_std::default_delete<YAML::Scanner::IndentMarker>_>
               .super__Head_base<0UL,_YAML::Scanner::IndentMarker_*,_false>._M_head_impl;
    }
    std::unique_ptr<YAML::Scanner::IndentMarker,_std::default_delete<YAML::Scanner::IndentMarker>_>
    ::~unique_ptr(&pIndent);
  }
  else {
    pIVar5 = (IndentMarker *)0x0;
  }
  return pIVar5;
}

Assistant:

Token* Scanner::PushToken(Token::TYPE type) {
  m_tokens.push(Token(type, INPUT.mark()));
  return &m_tokens.back();
}